

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::SingularVarBigint<bool,unsigned_short,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  char *pcVar4;
  ulong uVar5;
  ushort *puVar6;
  
  if (-1 < (long)*ptr) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x39f);
  }
  pcVar4 = (char *)((long)ptr[1] << 7 | 0x7f);
  if ((long)pcVar4 < 0) {
    uVar5 = (long)ptr[2] << 0xe | 0x3fff;
    if ((long)uVar5 < 0) {
      pcVar4 = (char *)((ulong)pcVar4 & ((long)ptr[3] << 0x15 | 0x1fffffU));
      if ((long)pcVar4 < 0) {
        uVar5 = uVar5 & ((long)ptr[4] << 0x1c | 0xfffffffU);
        if ((long)uVar5 < 0) {
          pcVar4 = (char *)((ulong)pcVar4 & ((long)ptr[5] << 0x23 | 0x7ffffffffU));
          if ((long)pcVar4 < 0) {
            uVar5 = uVar5 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
            if ((long)uVar5 < 0) {
              pcVar4 = (char *)((ulong)pcVar4 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU));
              if ((long)pcVar4 < 0) {
                uVar5 = uVar5 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                if ((long)uVar5 < 0) {
                  bVar1 = ptr[9];
                  puVar6 = (ushort *)(ptr + 10);
                  if (bVar1 != 1) {
                    if ((char)bVar1 < '\0') {
                      pcVar4 = Error(msg,pcVar4,ctx,data,table,hasbits);
                      return pcVar4;
                    }
                    if ((bVar1 & 1) == 0) {
                      uVar5 = uVar5 ^ 0x8000000000000000;
                    }
                  }
                }
                else {
                  puVar6 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar6 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar6 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar6 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar6 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar6 = (ushort *)(ptr + 4);
      }
    }
    else {
      puVar6 = (ushort *)(ptr + 3);
    }
    pcVar4 = (char *)((ulong)pcVar4 & uVar5);
  }
  else {
    puVar6 = (ushort *)(ptr + 2);
  }
  *(bool *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30)) =
       ((ulong)pcVar4 & (long)*ptr) != 0;
  if (puVar6 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar2 = (uint)table->fast_idx_mask & (uint)*puVar6;
    if ((uVar2 & 7) == 0) {
      uVar5 = (ulong)(uVar2 & 0xfffffff8);
      pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                                 (msg,puVar6,ctx,
                                  (ulong)*puVar6 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),
                                  table,hasbits);
      return pcVar4;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar3 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar3 = *puVar3 | (uint)hasbits;
  }
  return (char *)puVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}